

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::BitwiseAndFun::GetFunctions(void)

{
  LogicalType LVar1;
  BaseScalarFunction *pBVar2;
  NotImplementedException *this;
  ScalarFunction *function;
  long lVar3;
  BaseScalarFunction *function_00;
  ScalarFunctionSet *in_RDI;
  pointer pLVar4;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  allocator_type local_491;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *local_490 [2];
  undefined1 local_480 [16];
  ScalarFunctionSet *local_470;
  code *local_468;
  undefined8 local_460;
  code *local_458;
  code *local_450;
  undefined **local_448;
  ScalarFunctionSet *local_440;
  LogicalType *local_438;
  LogicalType local_430 [24];
  LogicalType local_418 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_400;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  code *local_3d8;
  undefined8 uStack_3d0;
  LogicalType local_3c0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3a8;
  LogicalType local_390 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_378;
  LogicalType local_360 [24];
  LogicalType local_348 [24];
  ScalarFunction local_330;
  undefined **local_208 [22];
  _Any_data local_158;
  _Manager_type local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  BaseScalarFunction local_e0 [176];
  
  local_470 = in_RDI;
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  duckdb::LogicalType::Integral();
  local_438 = local_400.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (local_400.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_400.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_440 = local_470 + 0x20;
    local_448 = &PTR__ScalarFunction_008914d8;
    pLVar4 = local_400.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      duckdb::LogicalType::LogicalType(local_430,pLVar4);
      duckdb::LogicalType::LogicalType(local_418,pLVar4);
      __l._M_len = 2;
      __l._M_array = local_430;
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_378,__l,&local_491);
      duckdb::LogicalType::LogicalType(local_390,pLVar4);
      LVar1 = *pLVar4;
      local_3d8 = (code *)0x0;
      uStack_3d0 = 0;
      local_3e8 = 0;
      uStack_3e0 = 0;
      if ((byte)LVar1 < 0x1c) {
        switch(LVar1) {
        case (LogicalType)0xb:
          local_490[0] = ScalarFunction::
                         BinaryFunction<signed_char,signed_char,signed_char,duckdb::BitwiseANDOperator>
          ;
          break;
        case (LogicalType)0xc:
          local_490[0] = ScalarFunction::
                         BinaryFunction<short,short,short,duckdb::BitwiseANDOperator>;
          break;
        case (LogicalType)0xd:
          local_490[0] = ScalarFunction::BinaryFunction<int,int,int,duckdb::BitwiseANDOperator>;
          break;
        case (LogicalType)0xe:
          local_490[0] = ScalarFunction::BinaryFunction<long,long,long,duckdb::BitwiseANDOperator>;
          break;
        default:
switchD_006f84b1_default:
          this = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_490[0] = (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)local_480;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_490,"Unimplemented type for GetScalarIntegerBinaryFunction","")
          ;
          duckdb::NotImplementedException::NotImplementedException(this,(string *)local_490);
          __cxa_throw(this,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else {
        switch(LVar1) {
        case (LogicalType)0x1c:
          local_490[0] = ScalarFunction::
                         BinaryFunction<unsigned_char,unsigned_char,unsigned_char,duckdb::BitwiseANDOperator>
          ;
          break;
        case (LogicalType)0x1d:
          local_490[0] = ScalarFunction::
                         BinaryFunction<unsigned_short,unsigned_short,unsigned_short,duckdb::BitwiseANDOperator>
          ;
          break;
        case (LogicalType)0x1e:
          local_490[0] = ScalarFunction::
                         BinaryFunction<unsigned_int,unsigned_int,unsigned_int,duckdb::BitwiseANDOperator>
          ;
          break;
        case (LogicalType)0x1f:
          local_490[0] = ScalarFunction::
                         BinaryFunction<unsigned_long,unsigned_long,unsigned_long,duckdb::BitwiseANDOperator>
          ;
          break;
        default:
          if (LVar1 == (LogicalType)0x31) {
            local_490[0] = ScalarFunction::
                           BinaryFunction<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BitwiseANDOperator>
            ;
          }
          else {
            if (LVar1 != (LogicalType)0x32) goto switchD_006f84b1_default;
            local_490[0] = ScalarFunction::
                           BinaryFunction<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BitwiseANDOperator>
            ;
          }
        }
      }
      std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
                ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                 &local_3e8,local_490);
      duckdb::LogicalType::LogicalType(local_348,INVALID);
      duckdb::ScalarFunction::ScalarFunction
                ((ScalarFunction *)local_208,&local_378,local_390,
                 (function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                 &local_3e8,0,0,0,0,local_348,0,0,0);
      std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
                 local_440,(ScalarFunction *)local_208);
      local_208[0] = local_448;
      if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
      }
      if (local_148 != (_Manager_type)0x0) {
        (*local_148)((_Any_data *)(local_208 + 0x16),(_Any_data *)(local_208 + 0x16),
                     __destroy_functor);
      }
      duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_208);
      duckdb::LogicalType::~LogicalType(local_348);
      if (local_3d8 != (code *)0x0) {
        (*local_3d8)((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                     &local_3e8,
                     (function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                     &local_3e8,3);
      }
      duckdb::LogicalType::~LogicalType(local_390);
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_378);
      lVar3 = 0x18;
      do {
        duckdb::LogicalType::~LogicalType(local_430 + lVar3);
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != -0x18);
      pLVar4 = pLVar4 + 0x18;
    } while (pLVar4 != local_438);
  }
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_400);
  duckdb::LogicalType::LogicalType(local_430,BIT);
  duckdb::LogicalType::LogicalType(local_418,BIT);
  __l_00._M_len = 2;
  __l_00._M_array = local_430;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_3a8,__l_00,(allocator_type *)local_490);
  duckdb::LogicalType::LogicalType(local_3c0,BIT);
  local_460 = 0;
  local_468 = BitwiseANDOperation;
  local_450 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_458 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_360,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_330,&local_3a8,local_3c0,&local_468,0,0,0,0,local_360,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (local_470 + 0x20),&local_330);
  local_330._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_330.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_330.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_330.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_330 + 0xb0U),(_Any_data *)((long)&local_330 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_330.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_360);
  if (local_458 != (code *)0x0) {
    (*local_458)(&local_468,&local_468,3);
  }
  duckdb::LogicalType::~LogicalType(local_3c0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3a8);
  lVar3 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_430 + lVar3);
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  function_00 = *(BaseScalarFunction **)(local_470 + 0x20);
  pBVar2 = *(BaseScalarFunction **)(local_470 + 0x28);
  if (function_00 != pBVar2) {
    do {
      BaseScalarFunction::SetReturnsError(local_e0,function_00);
      duckdb::BaseScalarFunction::~BaseScalarFunction(local_e0);
      function_00 = function_00 + 0x128;
    } while (function_00 != pBVar2);
  }
  return local_470;
}

Assistant:

ScalarFunctionSet BitwiseAndFun::GetFunctions() {
	ScalarFunctionSet functions;
	for (auto &type : LogicalType::Integral()) {
		functions.AddFunction(
		    ScalarFunction({type, type}, type, GetScalarIntegerBinaryFunction<BitwiseANDOperator>(type)));
	}
	functions.AddFunction(ScalarFunction({LogicalType::BIT, LogicalType::BIT}, LogicalType::BIT, BitwiseANDOperation));
	for (auto &function : functions.functions) {
		BaseScalarFunction::SetReturnsError(function);
	}
	return functions;
}